

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_form_insert2_unconstrain(REF_CAVITY ref_cavity,REF_INT faceid)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_INT *pRVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  uint local_54;
  REF_INT cell;
  REF_INT nodes [4];
  
  if ((ulong)ref_cavity->state != 2) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x498,
           "ref_cavity_form_insert2_unconstrain",
           "attempt to unconstrain cavity that is not boundary constrained",2,
           (ulong)ref_cavity->state);
    return 1;
  }
  ref_cell = ref_cavity->ref_grid->cell[3];
  ref_cavity->state = REF_CAVITY_UNKNOWN;
  local_54 = 1;
  lVar7 = 8;
  lVar9 = 0;
  do {
    if (ref_cavity->maxface <= lVar9) {
      uVar3 = ref_list_erase(ref_cavity->tet_list);
      if (uVar3 == 0) {
        ref_cavity->nface = 0;
        pRVar2 = ref_cavity->f2n;
        pRVar5 = pRVar2 + 1;
        lVar7 = 0;
        while (lVar7 < ref_cavity->maxface) {
          pRVar5[-1] = -1;
          lVar7 = lVar7 + 1;
          *pRVar5 = (REF_INT)lVar7;
          pRVar5 = pRVar5 + 3;
        }
        pRVar2[ref_cavity->maxface * 3 + -2] = -1;
        ref_cavity->blankface = 0;
        if (ref_cavity->debug != 0) {
          printf(" unconst form tri state %d of %d old %d new\n",(ulong)ref_cavity->state,
                 (ulong)(uint)ref_cavity->tri_list->n,(ulong)(uint)ref_cavity->nseg);
        }
        RVar4 = ref_cavity_verify_seg_manifold(ref_cavity);
        if (RVar4 == 0) {
          if (ref_cavity->debug != 0) {
            printf(" unconst manifold tri state %d\n",(ulong)ref_cavity->state);
          }
          if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
            return 1;
          }
          uVar3 = ref_cavity_enlarge_conforming(ref_cavity);
          if (uVar3 != 0) {
            pcVar8 = "enlarge boundary";
            uVar6 = 0x4bb;
LAB_00192254:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar6,"ref_cavity_form_insert2_unconstrain",(ulong)uVar3,pcVar8);
            return uVar3;
          }
          if (ref_cavity->debug != 0) {
            printf(" unconst enlarge tri state %d\n",(ulong)ref_cavity->state);
          }
          if (ref_cavity->state != REF_CAVITY_VISIBLE) {
            return 1;
          }
          ref_cavity->state = REF_CAVITY_UNKNOWN;
          uVar3 = ref_cavity_form_insert2_tet(ref_cavity,faceid);
          if (uVar3 == 0) {
            return 0;
          }
          pcVar8 = "form tet ball";
          uVar6 = 0x4c3;
        }
        else {
          pcVar8 = "ball seg manifold";
          uVar3 = 1;
          uVar6 = 0x4b6;
        }
      }
      else {
        pcVar8 = "erase tet list";
        uVar6 = 0x4a6;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar6,"ref_cavity_form_insert2_unconstrain",(ulong)uVar3,pcVar8);
      return uVar3;
    }
    pRVar5 = ref_cavity->f2n;
    iVar1 = *(int *)((long)pRVar5 + lVar7 + -8);
    if (iVar1 != -1) {
      nodes[1] = *(REF_INT *)((long)pRVar5 + lVar7 + -4);
      nodes[2] = *(REF_INT *)((long)pRVar5 + lVar7);
      nodes[0] = iVar1;
      uVar3 = ref_cell_with(ref_cell,nodes,&cell);
      if ((uVar3 != 0) && (uVar3 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x49f,"ref_cavity_form_insert2_unconstrain",(ulong)uVar3,"find tri");
        local_54 = uVar3;
      }
      if ((uVar3 != 5) && (uVar3 != 0)) {
        return local_54;
      }
      if ((((long)cell != -1) &&
          (ref_cell->c2n[(long)ref_cell->size_per * (long)cell + 3] == faceid)) &&
         (uVar3 = ref_cavity_add_tri(ref_cavity,cell), uVar3 != 0)) {
        pcVar8 = "tri";
        uVar6 = 0x4a1;
        goto LAB_00192254;
      }
    }
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + 0xc;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2_unconstrain(REF_CAVITY ref_cavity,
                                                       REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT face, nodes[4], cell;

  REIS(REF_CAVITY_BOUNDARY_CONSTRAINED, ref_cavity_state(ref_cavity),
       "attempt to unconstrain cavity that is not boundary constrained");
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  each_ref_cavity_valid_face(ref_cavity, face) {
    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find tri");
    if (REF_EMPTY != cell && ref_cell_c2n(ref_cell, 3, cell) == faceid) {
      RSS(ref_cavity_add_tri(ref_cavity, cell), "tri");
    }
  }

  /* undo faces */
  RSS(ref_list_erase(ref_cavity->tet_list), "erase tet list");
  ref_cavity_nface(ref_cavity) = 0;
  for (face = 0; face < ref_cavity_maxface(ref_cavity); face++) {
    ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
    ref_cavity_f2n(ref_cavity, 1, face) = face + 1;
  }
  ref_cavity_f2n(ref_cavity, 1, ref_cavity_maxface(ref_cavity) - 1) = REF_EMPTY;
  ref_cavity_blankface(ref_cavity) = 0;

  if (ref_cavity_debug(ref_cavity))
    printf(" unconst form tri state %d of %d old %d new\n",
           (int)ref_cavity_state(ref_cavity),
           ref_list_n(ref_cavity_tri_list(ref_cavity)),
           ref_cavity_nseg(ref_cavity));

  /* conform seg */
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf(" unconst manifold tri state %d\n",
           (int)ref_cavity_state(ref_cavity));
  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  RSS(ref_cavity_enlarge_conforming(ref_cavity), "enlarge boundary");
  if (ref_cavity_debug(ref_cavity))
    printf(" unconst enlarge tri state %d\n",
           (int)ref_cavity_state(ref_cavity));
  if (REF_CAVITY_VISIBLE != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  /* redo faces */
  RSS(ref_cavity_form_insert2_tet(ref_cavity, faceid), "form tet ball");

  return REF_SUCCESS;
}